

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O2

BVHNodeRecord<embree::NodeRefPtr<4>_> * __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMi<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
::recurse(BVHNodeRecord<embree::NodeRefPtr<4>_> *__return_storage_ptr__,
         BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMi<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
         *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc,bool toplevel)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar1;
  atomic<unsigned_long> *paVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  Vec3fx VVar5;
  ThreadLocal2 *this_00;
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  uint uVar6;
  char cVar7;
  size_t i;
  long *plVar8;
  MutexSys *this_01;
  BuildPrim *pBVar9;
  long lVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar11;
  float *pfVar12;
  size_t sVar13;
  runtime_error *this_02;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar18;
  range<unsigned_int> *prVar19;
  uint uVar20;
  uint uVar21;
  size_type sVar22;
  uint uVar23;
  ulong uVar24;
  Vec3fx *pVVar25;
  ulong uVar26;
  char *pcVar27;
  ulong uVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar31;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar32;
  size_t depth_local;
  BVHNodeRecord<embree::NodeRefPtr<4>_> *local_2c8;
  blocked_range<unsigned_long> local_2c0;
  range<unsigned_int> local_2a8;
  range<unsigned_int> local_2a0 [8];
  anon_class_8_1_898bcfc2 local_260;
  task_group_context context;
  anon_class_32_4_e5015336 local_1d8;
  BVHNodeRecord<embree::NodeRefPtr<4>_> bounds [8];
  ulong uVar17;
  
  depth_local = depth;
  if (alloc.alloc == (FastAllocator *)0x0) {
    alloc.alloc = (this->createAllocator->super_Create).allocator;
    plVar8 = (long *)__tls_get_addr(&PTR_021f8d38);
    this_01 = (MutexSys *)*plVar8;
    if (this_01 == (MutexSys *)0x0) {
      this_01 = (MutexSys *)FastAllocator::ThreadLocal2::operator_new(0xc0);
      MutexSys::MutexSys(this_01);
      this_01[1].mutex = (void *)0x0;
      this_01[8].mutex = this_01;
      this_01[9].mutex = (void *)0x0;
      this_01[10].mutex = (void *)0x0;
      this_01[0xb].mutex = (void *)0x0;
      this_01[0xc].mutex = (void *)0x0;
      this_01[0xd].mutex = (void *)0x0;
      this_01[0xe].mutex = (void *)0x0;
      this_01[0x10].mutex = this_01;
      this_01[0x11].mutex = (void *)0x0;
      this_01[0x12].mutex = (void *)0x0;
      this_01[0x13].mutex = (void *)0x0;
      this_01[0x14].mutex = (void *)0x0;
      this_01[0x15].mutex = (void *)0x0;
      this_01[0x16].mutex = (void *)0x0;
      *plVar8 = (long)this_01;
      bounds[0].ref.ptr = (size_t)&FastAllocator::s_thread_local_allocators_lock;
      bounds[0]._8_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      context.my_cpu_ctl_env = (uint64_t)this_01;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)&context);
      std::
      unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     *)&context);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)bounds);
    }
    alloc.talloc0 = (ThreadLocal *)(this_01 + 8);
    alloc.talloc1 = (ThreadLocal *)(this_01 + 0x10);
    if ((alloc.alloc)->use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
  }
  if ((toplevel) &&
     ((ulong)(current->_end - current->_begin) <= (this->super_Settings).singleThreadThreshold)) {
    (**(this->progressMonitor->super_BuildProgressMonitor)._vptr_BuildProgressMonitor)();
  }
  if ((this->super_Settings).maxDepth <= depth + 8) {
LAB_00458642:
    alloc_01.talloc0 = alloc.talloc0;
    alloc_01.alloc = alloc.alloc;
    alloc_01.talloc1 = alloc.talloc1;
    createLargeLeaf(__return_storage_ptr__,this,depth,current,alloc_01);
    return __return_storage_ptr__;
  }
  uVar18 = (ulong)current->_begin;
  uVar20 = current->_end;
  uVar28 = (ulong)uVar20;
  if ((ulong)(uVar20 - current->_begin) <= (this->super_Settings).minLeafSize) goto LAB_00458642;
  pBVar9 = this->morton;
  uVar15 = pBVar9[uVar18].field_0.field_0.code;
  uVar20 = pBVar9[uVar20 - 1].field_0.field_0.code;
  if (uVar15 == uVar20) {
LAB_00458670:
    recreateMortonCodes(this,current);
    pBVar9 = this->morton;
    uVar20 = current->_begin;
    uVar18 = (ulong)uVar20;
    uVar15 = current->_end;
    uVar28 = (ulong)uVar15;
    uVar21 = pBVar9[uVar18].field_0.field_0.code;
    uVar23 = pBVar9[uVar15 - 1].field_0.field_0.code;
    if (uVar21 != uVar23) {
      uVar23 = uVar23 ^ uVar21;
      iVar14 = 0x1f;
      if (uVar23 != 0) {
        for (; uVar23 >> iVar14 == 0; iVar14 = iVar14 + -1) {
        }
      }
      if (iVar14 != -1) goto LAB_0045808d;
    }
    uVar15 = uVar20 + uVar15 >> 1;
    uVar26 = (ulong)uVar15;
    local_2a8._end = uVar15;
    local_2a8._begin = uVar20;
  }
  else {
    uVar20 = uVar20 ^ uVar15;
    iVar14 = 0x1f;
    if (uVar20 != 0) {
      for (; uVar20 >> iVar14 == 0; iVar14 = iVar14 + -1) {
      }
    }
    if (iVar14 == -1) goto LAB_00458670;
LAB_0045808d:
    uVar17 = uVar18;
    uVar16 = uVar28;
    while( true ) {
      uVar26 = uVar16;
      if ((int)uVar17 + 1 == (int)uVar26) break;
      uVar16 = (ulong)((uint)((int)uVar26 + (int)uVar17) >> 1);
      if ((pBVar9[uVar16].field_0.field_0.code & 0x80000000U >> (~(byte)iVar14 & 0x1f)) == 0) {
        uVar17 = uVar16;
        uVar16 = uVar26;
      }
    }
    local_2a8 = (range<unsigned_int>)(uVar18 | uVar26 << 0x20);
  }
  local_2a0[0] = (range<unsigned_int>)(uVar28 << 0x20 | uVar26);
  for (uVar28 = 2; uVar28 < (this->super_Settings).branchingFactor; uVar28 = uVar28 + 1) {
    uVar20 = 0;
    uVar15 = 0xffffffff;
    for (uVar21 = 0; uVar18 = (ulong)uVar21, uVar18 < uVar28; uVar21 = uVar21 + 1) {
      uVar23 = (&local_2a8)[uVar18]._end - local_2a0[uVar18 - 1]._begin;
      uVar6 = uVar21;
      if ((ulong)uVar23 <= (this->super_Settings).minLeafSize || uVar23 <= uVar20) {
        uVar23 = uVar20;
        uVar6 = uVar15;
      }
      uVar15 = uVar6;
      uVar20 = uVar23;
    }
    if (uVar15 == 0xffffffff) break;
    prVar19 = local_2a0 + (long)(int)uVar15 + -1;
    uVar26 = (ulong)prVar19->_begin;
    uVar18 = (ulong)(&local_2a8)[(int)uVar15]._end;
    uVar20 = pBVar9[uVar26].field_0.field_0.code;
    uVar21 = pBVar9[(&local_2a8)[(int)uVar15]._end - 1].field_0.field_0.code;
    if (uVar20 == uVar21) {
LAB_004581d6:
      recreateMortonCodes(this,prVar19);
      pBVar9 = this->morton;
      uVar20 = prVar19->_begin;
      uVar26 = (ulong)uVar20;
      uVar15 = (&local_2a8)[(int)uVar15]._end;
      uVar18 = (ulong)uVar15;
      uVar21 = pBVar9[uVar26].field_0.field_0.code;
      uVar23 = pBVar9[uVar15 - 1].field_0.field_0.code;
      if (uVar21 != uVar23) {
        uVar23 = uVar23 ^ uVar21;
        iVar14 = 0x1f;
        if (uVar23 != 0) {
          for (; uVar23 >> iVar14 == 0; iVar14 = iVar14 + -1) {
          }
        }
        if (iVar14 != -1) goto LAB_00458173;
      }
      uVar15 = uVar20 + uVar15 >> 1;
      uVar17 = (ulong)uVar15;
      sVar22 = CONCAT44(uVar15,uVar20);
    }
    else {
      uVar21 = uVar21 ^ uVar20;
      iVar14 = 0x1f;
      if (uVar21 != 0) {
        for (; uVar21 >> iVar14 == 0; iVar14 = iVar14 + -1) {
        }
      }
      if (iVar14 == -1) goto LAB_004581d6;
LAB_00458173:
      uVar16 = uVar26;
      uVar24 = uVar18;
      while( true ) {
        uVar17 = uVar24;
        if ((int)uVar16 + 1 == (int)uVar17) break;
        uVar24 = (ulong)((uint)((int)uVar17 + (int)uVar16) >> 1);
        if ((pBVar9[uVar24].field_0.field_0.code & 0x80000000U >> (~(byte)iVar14 & 0x1f)) == 0) {
          uVar16 = uVar24;
          uVar24 = uVar17;
        }
      }
      sVar22 = uVar26 | uVar17 << 0x20;
    }
    *prVar19 = *(range<unsigned_int> *)(&local_2c0.my_grainsize + uVar28);
    (&local_2c0.my_grainsize)[uVar28] = sVar22;
    local_2a0[uVar28 - 1] = (range<unsigned_int>)(uVar18 << 0x20 | uVar17);
  }
  local_2c0.my_end = 0x80;
  this_00 = (alloc.talloc0)->parent;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    context.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i._0_1_ = 1;
    context.my_cpu_ctl_env = (uint64_t)this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    bounds[0].ref.ptr = (size_t)&FastAllocator::s_thread_local_allocators_lock;
    bounds[0]._8_1_ = 1;
    local_1d8.bounds = (BVHNodeRecord<embree::NodeRefPtr<4>_> (*) [8])this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&local_1d8);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)bounds);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&context);
  }
  (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + local_2c0.my_end;
  sVar13 = (alloc.talloc0)->cur;
  uVar18 = (ulong)(-(int)sVar13 & 0xf);
  uVar26 = sVar13 + local_2c0.my_end + uVar18;
  (alloc.talloc0)->cur = uVar26;
  if ((alloc.talloc0)->end < uVar26) {
    (alloc.talloc0)->cur = sVar13;
    if ((alloc.talloc0)->allocBlockSize < local_2c0.my_end << 2) {
      pcVar27 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_2c0);
    }
    else {
      bounds[0].ref.ptr = (alloc.talloc0)->allocBlockSize;
      pcVar27 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)bounds);
      (alloc.talloc0)->ptr = pcVar27;
      sVar13 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar13;
      (alloc.talloc0)->end = bounds[0].ref.ptr;
      (alloc.talloc0)->cur = local_2c0.my_end;
      if (bounds[0].ref.ptr < local_2c0.my_end) {
        (alloc.talloc0)->cur = 0;
        bounds[0].ref.ptr = (alloc.talloc0)->allocBlockSize;
        pcVar27 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)bounds);
        (alloc.talloc0)->ptr = pcVar27;
        sVar13 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar13;
        (alloc.talloc0)->end = bounds[0].ref.ptr;
        (alloc.talloc0)->cur = local_2c0.my_end;
        if (bounds[0].ref.ptr < local_2c0.my_end) {
          (alloc.talloc0)->cur = 0;
          pcVar27 = (char *)0x0;
        }
        else {
          (alloc.talloc0)->bytesWasted = sVar13;
        }
      }
      else {
        (alloc.talloc0)->bytesWasted = sVar13;
      }
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar18;
    pcVar27 = (alloc.talloc0)->ptr + (uVar26 - local_2c0.my_end);
  }
  auVar30 = _DAT_01f45a30;
  *(undefined1 (*) [16])(pcVar27 + 0x60) = _DAT_01f45a30;
  *(undefined1 (*) [16])(pcVar27 + 0x40) = auVar30;
  *(undefined1 (*) [16])(pcVar27 + 0x20) = auVar30;
  aVar32 = _DAT_01f45a40;
  *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar27 + 0x70) = _DAT_01f45a40;
  *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar27 + 0x50) = aVar32;
  *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar27 + 0x30) = aVar32;
  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
    pcVar3 = pcVar27 + lVar10 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
  }
  local_2c8 = __return_storage_ptr__;
  if ((this->super_Settings).singleThreadThreshold < (ulong)(current->_end - current->_begin)) {
    local_1d8.bounds = &bounds;
    local_1d8.depth = &depth_local;
    local_1d8.children = (range<unsigned_int> (*) [8])&local_2a8;
    local_1d8.this =
         (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
          *)this;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_2c0.my_begin = 0;
    local_2c0.my_grainsize = 1;
    local_2c0.my_end = uVar28;
    local_260.func = &local_1d8;
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::sse2::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::sse2::SetBVHNBounds<4>,embree::sse2::CreateMortonLeaf<4,embree::TriangleMi<4>>,embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,embree::Scene::BuildProgressMonitorInterface>::recurse(unsigned_long,embree::range<unsigned_int>const&,embree::FastAllocator::CachedAllocator,bool)::_lambda(embree::range<unsigned_long>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::sse2::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::sse2::SetBVHNBounds<4>,embree::sse2::CreateMortonLeaf<4,embree::TriangleMi<4>>,embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,embree::Scene::BuildProgressMonitorInterface>::recurse(unsigned_long,embree::range<unsigned_int>const&,embree::FastAllocator::CachedAllocator,bool)::_lambda(embree::range<unsigned_long>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
              (&local_2c0,&local_260,&context);
    cVar7 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar7 != '\0') {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"task cancelled");
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    auVar30 = _DAT_01f45a30;
    aVar32 = _DAT_01f45a40;
  }
  else {
    prVar19 = &local_2a8;
    pVVar25 = &bounds[0].bounds.upper;
    uVar18 = uVar28;
    while (bVar29 = uVar18 != 0, uVar18 = uVar18 - 1, bVar29) {
      alloc_00.talloc0 = alloc.talloc0;
      alloc_00.alloc = alloc.alloc;
      alloc_00.talloc1 = alloc.talloc1;
      recurse((BVHNodeRecord<embree::NodeRefPtr<4>_> *)&context,this,depth_local + 1,prVar19,
              alloc_00,false);
      *(uint64_t *)(pVVar25 + -2) = context.my_cpu_ctl_env;
      *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)(pVVar25 + -1) = context.field_6;
      *(context_list **)((long)&(((BBox3fx *)(pVVar25 + -1))->lower).field_0 + 8) =
           context.my_context_list;
      *(intrusive_list_node **)&pVVar25->field_0 = context.my_node.my_prev_node;
      *(intrusive_list_node **)((long)&pVVar25->field_0 + 8) = context.my_node.my_next_node;
      prVar19 = prVar19 + 1;
      pVVar25 = pVVar25 + 3;
      auVar30 = _DAT_01f45a30;
      aVar32 = _DAT_01f45a40;
    }
  }
  paVar11 = &bounds[0].bounds.upper.field_0;
  for (uVar18 = 0; aVar31._0_12_ = auVar30._0_12_, uVar28 != uVar18; uVar18 = uVar18 + 1) {
    paVar1 = paVar11 + -1;
    auVar4._0_4_ = *(float *)paVar1;
    auVar4._4_4_ = *(float *)((long)paVar1 + 4);
    auVar4._8_4_ = *(float *)((long)paVar1 + 8);
    auVar4._12_4_ =
         *(anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
           *)((long)paVar1 + 0xc);
    VVar5.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fx_0)
         *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)&paVar11->field_1;
    auVar30 = minps(auVar30,auVar4);
    aVar32.m128 = (__m128)maxps(aVar32.m128,(undefined1  [16])VVar5.field_0);
    *(undefined8 *)(pcVar27 + uVar18 * 8) = *(undefined8 *)(paVar11 + -2);
    *(undefined4 *)(pcVar27 + uVar18 * 4 + 0x20) = auVar4._0_4_;
    *(undefined4 *)(pcVar27 + uVar18 * 4 + 0x40) = auVar4._4_4_;
    *(undefined4 *)(pcVar27 + uVar18 * 4 + 0x60) = auVar4._8_4_;
    *(int *)(pcVar27 + uVar18 * 4 + 0x30) = VVar5.field_0._0_4_;
    *(int *)(pcVar27 + uVar18 * 4 + 0x50) = VVar5.field_0._4_4_;
    *(int *)(pcVar27 + uVar18 * 4 + 0x70) = VVar5.field_0._8_4_;
    paVar11 = paVar11 + 3;
  }
  pfVar12 = bounds[0].bounds.lower.field_0.m128 + 3;
  uVar26 = 0;
  uVar18 = uVar28;
  while (bVar29 = uVar18 != 0, uVar18 = uVar18 - 1, bVar29) {
    uVar26 = uVar26 + (long)(int)*pfVar12;
    pfVar12 = pfVar12 + 0xc;
  }
  if (0xfff < uVar26) {
    pfVar12 = bounds[0].bounds.lower.field_0.m128 + 3;
    for (uVar18 = 0; uVar28 != uVar18; uVar18 = uVar18 + 1) {
      if ((int)*pfVar12 < 0x1000) {
        BVHNRotate<4>::rotate((NodeRef)*(size_t *)(pcVar27 + uVar18 * 8),1);
        pcVar27[uVar18 * 8 + 7] = pcVar27[uVar18 * 8 + 7] | 0x80;
      }
      pfVar12 = pfVar12 + 0xc;
    }
  }
  aVar31.m128[3] = (float)(int)uVar26;
  (local_2c8->ref).ptr = (size_t)pcVar27;
  (local_2c8->bounds).lower.field_0 = aVar31;
  (local_2c8->bounds).upper.field_0 = aVar32;
  return local_2c8;
}

Assistant:

ReductionTy recurse(size_t depth, const range<unsigned>& current, Allocator alloc, bool toplevel)
        {
          /* get thread local allocator */
          if (!alloc)
            alloc = createAllocator();

          /* call memory monitor function to signal progress */
          if (toplevel && current.size() <= singleThreadThreshold)
            progressMonitor(current.size());

          /* create leaf node */
          if (unlikely(depth+MIN_LARGE_LEAF_LEVELS >= maxDepth || current.size() <= minLeafSize))
            return createLargeLeaf(depth,current,alloc);

          /* fill all children by always splitting the one with the largest surface area */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          split(current,children[0],children[1]);
          size_t numChildren = 2;

          while (numChildren < branchingFactor)
          {
            /* find best child with largest number of primitives */
            int bestChild = -1;
            unsigned bestItems = 0;
            for (unsigned int i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= minLeafSize)
                continue;

              /* remember child with largest area */
              if (children[i].size() > bestItems) {
                bestItems = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == -1) break;

            /*! split best child into left and right child */
            range<unsigned> left, right;
            split(children[bestChild],left,right);

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = left;
            children[numChildren+0] = right;
            numChildren++;
          }

          /* create leaf node if no split is possible */
          if (unlikely(numChildren == 1))
            return createLeaf(current,alloc);

          /* allocate node */
          auto node = createNode(alloc,numChildren);

          /* process top parts of tree parallel */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          if (current.size() > singleThreadThreshold)
          {
            /*! parallel_for is faster than spawning sub-tasks */
            parallel_for(size_t(0), numChildren, [&] (const range<size_t>& r) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  bounds[i] = recurse(depth+1,children[i],nullptr,true);
                  _mm_mfence(); // to allow non-temporal stores during build
                }
              });
          }

          /* finish tree sequentially */
          else
          {
            for (size_t i=0; i<numChildren; i++)
              bounds[i] = recurse(depth+1,children[i],alloc,false);
          }

          return setBounds(node,bounds,numChildren);
        }